

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O3

MessageLite *
google::protobuf::internal::GetOwnedMessageInternal
          (Arena *message_arena,MessageLite *submessage,Arena *submessage_arena)

{
  ulong uVar1;
  int iVar2;
  Arena *pAVar3;
  LogMessage *pLVar4;
  undefined4 extraout_var;
  LogFinisher local_59;
  LogMessage local_58;
  MessageLite *pMVar5;
  
  uVar1 = (submessage->_internal_metadata_).ptr_;
  if ((uVar1 & 2) == 0) {
    pAVar3 = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      pAVar3 = *(Arena **)pAVar3;
    }
  }
  else {
    pAVar3 = (Arena *)0x0;
  }
  if (pAVar3 != submessage_arena) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_util.cc"
               ,0x2fa);
    pLVar4 = LogMessage::operator<<
                       (&local_58,
                        "CHECK failed: Arena::InternalHelper<MessageLite>::GetOwningArena(submessage) == submessage_arena: "
                       );
    LogFinisher::operator=(&local_59,pLVar4);
    LogMessage::~LogMessage(&local_58);
  }
  if (message_arena == submessage_arena) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_util.cc"
               ,0x2fb);
    pLVar4 = LogMessage::operator<<(&local_58,"CHECK failed: message_arena != submessage_arena: ");
    LogFinisher::operator=(&local_59,pLVar4);
    LogMessage::~LogMessage(&local_58);
  }
  if (submessage_arena == (Arena *)0x0) {
    if (message_arena != (Arena *)0x0) {
      ThreadSafeArena::AddCleanup
                ((ThreadSafeArena *)message_arena,submessage,
                 arena_delete_object<google::protobuf::MessageLite>);
      return submessage;
    }
  }
  else {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_util.cc"
               ,0x2fc);
    pLVar4 = LogMessage::operator<<(&local_58,"CHECK failed: (submessage_arena) == (nullptr): ");
    LogFinisher::operator=(&local_59,pLVar4);
    LogMessage::~LogMessage(&local_58);
  }
  iVar2 = (*submessage->_vptr_MessageLite[3])(submessage,message_arena);
  pMVar5 = (MessageLite *)CONCAT44(extraout_var,iVar2);
  (*pMVar5->_vptr_MessageLite[7])(pMVar5,submessage);
  return pMVar5;
}

Assistant:

MessageLite* GetOwnedMessageInternal(Arena* message_arena,
                                     MessageLite* submessage,
                                     Arena* submessage_arena) {
  GOOGLE_DCHECK(Arena::InternalHelper<MessageLite>::GetOwningArena(submessage) ==
         submessage_arena);
  GOOGLE_DCHECK(message_arena != submessage_arena);
  GOOGLE_DCHECK_EQ(submessage_arena, nullptr);
  if (message_arena != nullptr && submessage_arena == nullptr) {
    message_arena->Own(submessage);
    return submessage;
  } else {
    MessageLite* ret = submessage->New(message_arena);
    ret->CheckTypeAndMergeFrom(*submessage);
    return ret;
  }
}